

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckArrayCloseDoesNotHaveSideEffectsWhenPassing::
~TestCheckArrayCloseDoesNotHaveSideEffectsWhenPassing
          (TestCheckArrayCloseDoesNotHaveSideEffectsWhenPassing *this)

{
  TestCheckArrayCloseDoesNotHaveSideEffectsWhenPassing *this_local;
  
  ~TestCheckArrayCloseDoesNotHaveSideEffectsWhenPassing(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckArrayCloseDoesNotHaveSideEffectsWhenPassing)
{
    g_sideEffect = 0;
    {
        UnitTest::TestResults testResults;
		ScopedCurrentTest scopedResults(testResults);

		const float data[] = { 0, 1, 2, 3 };
        CHECK_ARRAY_CLOSE (data, FunctionWithSideEffects2(), 4, 0.01f);
    }
    CHECK_EQUAL(1, g_sideEffect);
}